

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

void __thiscall
ctemplate::TemplateDictionary::DictionaryPrinter::DumpSectionDict
          (DictionaryPrinter *this,SectionDict *section_dict)

{
  TemplateDictionary *pTVar1;
  _Rb_tree_node_base *p_Var2;
  long lVar3;
  _Base_ptr p_Var4;
  undefined8 *puVar5;
  allocator local_16b;
  allocator local_16a;
  allocator local_169;
  undefined8 *local_168;
  _Rb_tree_node_base *local_160;
  _Rb_tree_node_base *local_158;
  TemplateDictionary *local_150;
  undefined8 *local_148;
  string local_140;
  string local_120;
  string local_100;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>_>
  sorted_section_dict;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  sorted_section_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sorted_section_dict._M_t._M_impl.super__Rb_tree_header._M_header;
  sorted_section_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sorted_section_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sorted_section_dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sorted_section_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sorted_section_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  SortSections<std::map<std::__cxx11::string,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>const*>>>,ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>>
            (this,&sorted_section_dict,section_dict);
  p_Var4 = sorted_section_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var4 != &sorted_section_dict._M_t._M_impl.super__Rb_tree_header) {
    local_158 = p_Var4 + 1;
    lVar3 = *(long *)(p_Var4 + 2);
    puVar5 = *(undefined8 **)(lVar3 + 8);
    local_168 = puVar5;
    local_160 = p_Var4;
    while (p_Var2 = local_160, puVar5 != *(undefined8 **)(lVar3 + 0x10)) {
      pTVar1 = (TemplateDictionary *)*puVar5;
      local_148 = puVar5;
      std::__cxx11::string::string((string *)&local_100,"section ",&local_169);
      std::__cxx11::string::string((string *)&local_50,(string *)local_158);
      std::__cxx11::string::string((string *)&local_b0," (dict ",&local_16a);
      lVar3 = *(long *)(*(long *)(p_Var2 + 2) + 8);
      GetDictNum_abi_cxx11_
                (&local_70,this,((long)local_168 - lVar3 >> 3) + 1,
                 *(long *)(*(long *)(p_Var2 + 2) + 0x10) - lVar3 >> 3);
      std::__cxx11::string::string((string *)&local_90,") -->\n",&local_16b);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      local_120._M_string_length = 0;
      local_120.field_2._M_local_buf[0] = '\0';
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      local_140._M_string_length = 0;
      local_140.field_2._M_local_buf[0] = '\0';
      local_150 = pTVar1;
      IndentedWriter::Write
                (&this->writer_,&local_100,&local_50,&local_b0,&local_70,&local_90,&local_120,
                 &local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_100);
      IndentedWriter::Indent(&this->writer_);
      DumpToString(this,local_150);
      IndentedWriter::Dedent(&this->writer_);
      lVar3 = *(long *)(local_160 + 2);
      local_168 = local_168 + 1;
      puVar5 = local_148 + 1;
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(local_160);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>_>
  ::~_Rb_tree(&sorted_section_dict._M_t);
  return;
}

Assistant:

void DumpSectionDict(const SectionDict& section_dict) {
    map<string, const DictVector*> sorted_section_dict;
    SortSections(&sorted_section_dict, section_dict);
    for (map<string, const DictVector*>::const_iterator it =
             sorted_section_dict.begin();
         it != sorted_section_dict.end(); ++it) {
      for (DictVector::const_iterator it2 = it->second->begin();
           it2 != it->second->end(); ++it2) {
        TemplateDictionary* dict = *it2;
        writer_.Write("section ", it->first, " (dict ",
                      GetDictNum(it2 - it->second->begin() + 1,
                                 it->second->size()),
                      ") -->\n");
        writer_.Indent();
        DumpToString(*dict);
        writer_.Dedent();
      }
    }
  }